

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

int GA_Pgroup_create(int *list,int count)

{
  void *__ptr;
  Integer IVar1;
  int in_ESI;
  long in_RDI;
  Integer *_ga_map_capi;
  int grp_id;
  int i;
  Integer acount;
  Integer in_stack_00000028;
  Integer *in_stack_00000030;
  undefined4 local_1c;
  
  __ptr = malloc((long)in_ESI << 3);
  for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
    *(long *)((long)__ptr + (long)local_1c * 8) = (long)*(int *)(in_RDI + (long)local_1c * 4);
  }
  IVar1 = pnga_pgroup_create(in_stack_00000030,in_stack_00000028);
  free(__ptr);
  return (int)IVar1;
}

Assistant:

int GA_Pgroup_create(int *list, int count)
{
    Integer acount = (Integer)count;
    int i;
    int grp_id;
    Integer *_ga_map_capi;
    _ga_map_capi = (Integer*)malloc(count * sizeof(Integer));
    for (i=0; i<count; i++)
       _ga_map_capi[i] = (Integer)list[i];
    grp_id = (int)wnga_pgroup_create(_ga_map_capi,acount);
    free(_ga_map_capi);
    return grp_id;
}